

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomialfit.cpp
# Opt level: O3

void __thiscall PolynomialFit::releaseMatrix(PolynomialFit *this)

{
  if (this->matrix != (fraction *)0x0) {
    operator_delete__(this->matrix);
    this->matrix = (fraction *)0x0;
  }
  if (this->rvector != (fraction *)0x0) {
    operator_delete__(this->rvector);
    this->rvector = (fraction *)0x0;
  }
  if (this->results != (fraction *)0x0) {
    operator_delete__(this->results);
    this->results = (fraction *)0x0;
  }
  return;
}

Assistant:

void PolynomialFit::releaseMatrix()
{
    if(matrix ){
        delete [] matrix ;
        matrix = NULL;
    }

    if(rvector){
        delete [] rvector;
        rvector = NULL;
    }

    if(results){
        delete [] results;
        results = NULL;
    }
}